

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool.c
# Opt level: O1

int run_test_threadpool_queue_work_simple(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_work_t *puVar2;
  undefined8 uVar3;
  uv_work_t *puVar4;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  
  work_req.data = &data;
  puVar4 = &work_req;
  puVar2 = (uv_work_t *)uv_default_loop();
  iVar5 = 0x506a08;
  iVar1 = uv_queue_work(puVar2,&work_req,work_cb,after_work_cb);
  if (iVar1 == 0) {
    puVar2 = (uv_work_t *)uv_default_loop();
    iVar5 = 0;
    uv_run();
    if (work_cb_count != 1) goto LAB_001767de;
    if (after_work_cb_count != 1) goto LAB_001767e3;
    puVar4 = (uv_work_t *)uv_default_loop();
    uv_walk(puVar4,close_walk_cb,0);
    iVar5 = 0;
    uv_run(puVar4);
    puVar2 = (uv_work_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_threadpool_queue_work_simple_cold_1();
LAB_001767de:
    run_test_threadpool_queue_work_simple_cold_2();
LAB_001767e3:
    run_test_threadpool_queue_work_simple_cold_3();
  }
  run_test_threadpool_queue_work_simple_cold_4();
  if (puVar2 == &work_req) {
    if ((char *)work_req.data == &data) {
      work_cb_count = work_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    work_cb_cold_1();
  }
  work_cb_cold_2();
  if (iVar5 == 0) {
    if (puVar2 != &work_req) goto LAB_0017684a;
    if ((char *)work_req.data == &data) {
      after_work_cb_count = after_work_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    after_work_cb_cold_1();
LAB_0017684a:
    after_work_cb_cold_2();
  }
  after_work_cb_cold_3();
  work_req.data = &data;
  uVar3 = uv_default_loop();
  iVar1 = uv_queue_work(uVar3,&work_req,0,after_work_cb,in_R8,in_R9,puVar4);
  if (iVar1 == -0x16) {
    uVar3 = uv_default_loop();
    uv_run(uVar3,0);
    if (work_cb_count != 0) goto LAB_001768e6;
    if (after_work_cb_count == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001768f0;
    }
  }
  else {
    run_test_threadpool_queue_work_einval_cold_1();
LAB_001768e6:
    run_test_threadpool_queue_work_einval_cold_2();
  }
  run_test_threadpool_queue_work_einval_cold_3();
LAB_001768f0:
  run_test_threadpool_queue_work_einval_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(uVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(threadpool_queue_work_simple) {
  int r;

  work_req.data = &data;
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}